

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintString(FieldValuePrinter *this,string *val)

{
  string *psVar1;
  StringBaseTextGenerator *in_RDI;
  StringBaseTextGenerator generator;
  StringBaseTextGenerator *this_00;
  BaseTextGenerator *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  FastFieldValuePrinter *in_stack_ffffffffffffffd0;
  
  this_00 = in_RDI;
  anon_unknown_19::StringBaseTextGenerator::StringBaseTextGenerator(in_RDI);
  FastFieldValuePrinter::PrintString
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  psVar1 = (anonymous_namespace)::StringBaseTextGenerator::Get_abi_cxx11_
                     ((StringBaseTextGenerator *)&stack0xffffffffffffffc0);
  std::__cxx11::string::string((string *)this_00,(string *)psVar1);
  anon_unknown_19::StringBaseTextGenerator::~StringBaseTextGenerator(this_00);
  return (string *)in_RDI;
}

Assistant:

std::string TextFormat::FieldValuePrinter::PrintString(
    const std::string& val) const {
  FORWARD_IMPL(PrintString, val);
}